

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

Matrix<float,_4,_2> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::decrement<float,4,2>
          (Matrix<float,_4,_2> *__return_storage_ptr__,MatrixCaseUtils *this,
          Matrix<float,_4,_2> *mat)

{
  float fVar1;
  float *pfVar2;
  undefined4 local_24;
  undefined4 local_20;
  int c;
  int r;
  Matrix<float,_4,_2> *mat_local;
  Matrix<float,_4,_2> *retVal;
  
  tcu::Matrix<float,_4,_2>::Matrix(__return_storage_ptr__);
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
      pfVar2 = tcu::Matrix<float,_4,_2>::operator()((Matrix<float,_4,_2> *)this,local_20,local_24);
      fVar1 = *pfVar2;
      pfVar2 = tcu::Matrix<float,_4,_2>::operator()(__return_storage_ptr__,local_20,local_24);
      *pfVar2 = fVar1 + -1.0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<T, Rows, Cols> decrement (const tcu::Matrix<T, Rows, Cols>& mat)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = mat(r, c) - 1.0f;

	return retVal;
}